

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncVertexArray::Setup(AdvancedSyncVertexArray *this)

{
  this->m_color_buffer_tex = 0;
  this->m_element_buffer_tex = 0;
  this->m_store_program = 0;
  this->m_draw_program = 0;
  this->m_position_buffer = 0;
  this->m_color_buffer = 0;
  this->m_element_buffer = 0;
  this->m_position_buffer_tex = 0;
  this->m_attribless_vao = 0;
  this->m_draw_vao = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_position_buffer	 = 0;
		m_color_buffer		  = 0;
		m_element_buffer	  = 0;
		m_position_buffer_tex = 0;
		m_color_buffer_tex	= 0;
		m_element_buffer_tex  = 0;
		m_store_program		  = 0;
		m_draw_program		  = 0;
		m_attribless_vao	  = 0;
		m_draw_vao			  = 0;
		return NO_ERROR;
	}